

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.h
# Opt level: O0

void __thiscall hwnet::TCPSocket::linklist::clear(linklist *this)

{
  sendContext *psVar1;
  sendContext *c;
  sendContext *cur;
  linklist *this_local;
  
  if (this->head != (sendContext *)0x0) {
    c = this->head;
    while (c != (sendContext *)0x0) {
      psVar1 = c->next;
      putSendContext(c);
      c = psVar1;
    }
    this->tail = (sendContext *)0x0;
    this->head = (sendContext *)0x0;
  }
  return;
}

Assistant:

void clear() {
			if(this->head != nullptr) {
				auto cur = this->head;
				while(cur != nullptr){
					auto c = cur;
					cur = c->next;
					putSendContext(c);
				}
				this->head = this->tail = nullptr;
			}		
		}